

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  Col *pCVar1;
  fpclass_type *pfVar2;
  fpclass_type *pfVar3;
  int iVar4;
  int iVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  fpclass_type *pfVar17;
  fpclass_type *pfVar18;
  Dring *pDVar19;
  
  pCVar1 = &(this->u).col;
  pDVar19 = (this->u).col.list.next;
  if ((Col *)pDVar19 == pCVar1) {
    uVar12 = 0;
  }
  else {
    pnVar6 = (this->u).col.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar7 = (this->u).col.idx;
    piVar8 = (this->u).col.len;
    piVar9 = (this->u).col.max;
    piVar10 = (this->u).col.start;
    uVar14 = 0;
    do {
      iVar4 = pDVar19->idx;
      if (piVar10[iVar4] != (int)uVar14) {
        do {
          iVar4 = pDVar19->idx;
          iVar5 = piVar10[iVar4];
          iVar13 = (int)uVar14;
          piVar10[iVar4] = iVar13;
          piVar9[iVar4] = piVar8[iVar4];
          iVar4 = piVar8[iVar4];
          if (0 < iVar4) {
            uVar14 = (long)iVar13;
            lVar15 = (long)iVar5;
            pfVar18 = &(pnVar6->m_backend).fpclass;
            do {
              pfVar2 = pfVar18 + (long)iVar5 * 0x20;
              pfVar3 = pfVar18 + (long)iVar13 * 0x20 + -0x1e;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)(pfVar2 + -0x1e);
              pfVar17 = pfVar3;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *pfVar17 = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((pcVar16->data)._M_elems + 1);
                pfVar17 = pfVar17 + 1;
              }
              pfVar3[0x1c] = pfVar2[-2];
              *(bool *)(pfVar3 + 0x1d) = *(bool *)(pfVar2 + -1);
              *(undefined8 *)(pfVar3 + 0x1e) = *(undefined8 *)pfVar2;
              piVar7[uVar14] = piVar7[lVar15];
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 1;
              pfVar18 = pfVar18 + 0x20;
            } while (lVar15 < iVar4 + iVar5);
          }
          uVar12 = (uint)uVar14;
          pDVar19 = pDVar19->next;
        } while ((Col *)pDVar19 != pCVar1);
        break;
      }
      uVar12 = (int)uVar14 + piVar8[iVar4];
      uVar14 = (ulong)uVar12;
      piVar9[iVar4] = piVar8[iVar4];
      pDVar19 = pDVar19->next;
    } while ((Col *)pDVar19 != pCVar1);
  }
  (this->u).col.used = uVar12;
  (this->u).col.max[this->thedim] = 0;
  return;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}